

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O0

void test_gfmul(void)

{
  __m256i X;
  __m256i X_00;
  __m256i X_01;
  __m256i X_02;
  __m256i X_03;
  __m256i X_04;
  __m256i X_05;
  __m256i X_06;
  __m256i X_07;
  __m256i X_08;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  size_t __size;
  ptls_fusion_aesgcm_context_t *__dest;
  ptls_fusion_aesgcm_ghash_precompute128 *in_RCX;
  ptls_fusion_aesgcm_ghash_precompute128 *ppVar6;
  longlong extraout_RDX;
  longlong lVar7;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  longlong extraout_RDX_07;
  longlong extraout_RDX_08;
  longlong extraout_RDX_09;
  longlong extraout_RDX_10;
  longlong extraout_RDX_11;
  longlong extraout_RDX_12;
  longlong extraout_RDX_13;
  longlong extraout_RDX_14;
  longlong extraout_RDX_15;
  longlong extraout_RDX_16;
  __m128i X_09;
  __m128i X_10;
  __m128i X_11;
  __m128i X_12;
  __m128i X_13;
  __m128i X_14;
  __m128i X_15;
  __m128i X_16;
  __m128i X_17;
  __m128i X_18;
  __m128i X_19;
  __m128i X_20;
  __m128i X_21;
  __m128i X_22;
  __m128i X_23;
  __m128i X_24;
  __m128i X_25;
  ptls_fusion_gfmul_state128 state_9;
  ptls_fusion_gfmul_state256 state_8;
  __m128i hash_4;
  ptls_fusion_gfmul_state128 state_7;
  ptls_fusion_gfmul_state256 state_6;
  __m128i hash_3;
  ptls_fusion_gfmul_state128 state_5;
  ptls_fusion_gfmul_state256 state_4;
  __m128i hash_2;
  ptls_fusion_gfmul_state128 state_3;
  ptls_fusion_gfmul_state256 state_2;
  __m128i hash_1;
  ptls_fusion_gfmul_state128 state_1;
  ptls_fusion_gfmul_state256 state;
  __m128i hash;
  __m128i H0;
  size_t ghash_cnt;
  ptls_fusion_aesgcm_context_t *ctx;
  ptls_fusion_aesgcm_ghash_precompute256 *in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7b0;
  int in_stack_fffffffffffff7b4;
  uint in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7bc;
  undefined4 uVar8;
  undefined8 in_stack_fffffffffffff7c0;
  undefined1 *puVar9;
  undefined1 *in_stack_fffffffffffff7c8;
  ptls_fusion_gfmul_state256 *in_stack_fffffffffffff7d0;
  ptls_fusion_gfmul_state256 *in_stack_fffffffffffff7f0;
  undefined1 local_7e0 [32];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_780;
  undefined8 uStack_778;
  ptls_fusion_gfmul_state128 local_770;
  undefined1 local_740 [32];
  longlong local_720;
  longlong lStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  longlong local_6e0;
  longlong lStack_6d8;
  ptls_fusion_gfmul_state128 local_6d0;
  ptls_fusion_gfmul_state256 local_6a0;
  longlong local_640;
  longlong lStack_638;
  ptls_fusion_gfmul_state128 local_630;
  longlong local_5e0;
  longlong lStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  longlong local_5a0;
  longlong lStack_598;
  ptls_fusion_gfmul_state128 local_590;
  longlong local_540;
  longlong lStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  longlong local_500;
  longlong lStack_4f8;
  char local_4f0 [8];
  char acStack_4e8 [8];
  undefined1 local_4e0 [484];
  undefined1 local_2fc;
  long local_2e0;
  size_t local_2b0;
  ptls_fusion_aesgcm_context_t *local_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  longlong local_1a0;
  longlong lStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  longlong local_180;
  longlong lStack_178;
  longlong lStack_170;
  longlong lStack_168;
  longlong local_160;
  longlong lStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  longlong local_140;
  longlong lStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_2b0 = 4;
  __size = calc_aesgcm_context_size(&local_2b0,ptls_fusion_can_aesni256);
  __dest = (ptls_fusion_aesgcm_context_t *)malloc(__size);
  local_2a8 = __dest;
  memset(local_4e0,0,0x220);
  local_2fc = (undefined1)ptls_fusion_can_aesni256;
  local_2e0 = local_2b0 << 4;
  memcpy(__dest,local_4e0,0x220);
  local_1c8 = "hello world bye";
  local_4f0[0] = 'h';
  local_4f0[1] = 'e';
  local_4f0[2] = 'l';
  local_4f0[3] = 'l';
  local_4f0[4] = 'o';
  local_4f0[5] = ' ';
  local_4f0[6] = 'w';
  local_4f0[7] = 'o';
  acStack_4e8[0] = 'r';
  acStack_4e8[1] = 'l';
  acStack_4e8[2] = 'd';
  acStack_4e8[3] = ' ';
  acStack_4e8[4] = 'b';
  acStack_4e8[5] = 'y';
  acStack_4e8[6] = 'e';
  acStack_4e8[7] = '\0';
  lVar7 = extraout_RDX;
  if ((local_2a8->ecb).aesni256 == '\0') {
    local_2a8[1].ecb.keys.m128[0][0] = 0x6f77206f6c6c6568;
    local_2a8[1].ecb.keys.m128[0][1] = 0x65796220646c72;
  }
  else {
    local_2a8[1].ecb.keys.m128[1][0] = 0x6f77206f6c6c6568;
    local_2a8[1].ecb.keys.m128[1][1] = 0x65796220646c72;
  }
  while (local_2a8->ghash_cnt < local_2b0) {
    setup_one_ghash_entry(local_2a8);
    lVar7 = extraout_RDX_00;
  }
  if ((local_2a8->ecb).aesni256 == '\0') {
    local_260 = 0;
    uStack_258 = 0;
    local_590.lo[0] = 0;
    local_590.lo[1] = 0;
    local_1d0 = "deaddeadbeefbeef";
    X_09[0] = local_2a8 + 1;
    X_09[1] = lVar7;
    gfmul_firststep128(&local_590,X_09,in_RCX);
    gfmul_reduce128(&local_590);
    local_500 = local_590.lo[0];
    lStack_4f8 = local_590.lo[1];
  }
  else {
    local_a0 = 0;
    uStack_98 = 0;
    uStack_90 = 0;
    uStack_88 = 0;
    local_540 = 0;
    lStack_538 = 0;
    uStack_530 = 0;
    uStack_528 = 0;
    local_38 = "deaddeadbeefbeef";
    X[0]._4_4_ = in_stack_fffffffffffff7bc;
    X[0]._0_4_ = in_stack_fffffffffffff7b8;
    X[1] = in_stack_fffffffffffff7c0;
    X[2] = (longlong)in_stack_fffffffffffff7c8;
    X[3] = (longlong)in_stack_fffffffffffff7d0;
    gfmul_firststep256(in_stack_fffffffffffff7f0,X,in_stack_fffffffffffff7b4,
                       in_stack_fffffffffffff7a8);
    gfmul_reduce256(in_stack_fffffffffffff7d0);
    local_140 = local_540;
    lStack_138 = lStack_538;
    uStack_130 = uStack_530;
    uStack_128 = uStack_528;
    local_500 = local_540;
    lStack_4f8 = lStack_538;
  }
  auVar5._8_8_ = lStack_4f8;
  auVar5._0_8_ = local_500;
  ppVar6 = (ptls_fusion_aesgcm_ghash_precompute128 *)0x7f;
  _ok((uint)(auVar5 == _DAT_00152aa0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c");
  if ((local_2a8->ecb).aesni256 == '\0') {
    local_270 = 0;
    uStack_268 = 0;
    local_630.lo[0] = 0;
    local_630.lo[1] = 0;
    local_1d8 = "Lorem ipsum dolor sit amet, con";
    X_10[0] = (undefined1 *)((long)&local_2a8[1].ecb.keys + 0x20);
    X_10[1] = extraout_RDX_01;
    gfmul_firststep128(&local_630,X_10,ppVar6);
    local_1e0 = "r sit amet, con";
    X_11[0] = local_2a8 + 1;
    X_11[1] = extraout_RDX_02;
    gfmul_nextstep128(&local_630,X_11,ppVar6);
    gfmul_reduce128(&local_630);
    local_5a0 = local_630.lo[0];
    lStack_598 = local_630.lo[1];
  }
  else {
    local_c0 = 0;
    uStack_b8 = 0;
    uStack_b0 = 0;
    uStack_a8 = 0;
    local_5e0 = 0;
    lStack_5d8 = 0;
    uStack_5d0 = 0;
    uStack_5c8 = 0;
    local_40 = "Lorem ipsum dolor sit amet, con";
    X_00[0]._4_4_ = in_stack_fffffffffffff7bc;
    X_00[0]._0_4_ = in_stack_fffffffffffff7b8;
    X_00[1] = in_stack_fffffffffffff7c0;
    X_00[2] = (longlong)in_stack_fffffffffffff7c8;
    X_00[3] = (longlong)in_stack_fffffffffffff7d0;
    gfmul_firststep256(in_stack_fffffffffffff7f0,X_00,in_stack_fffffffffffff7b4,
                       in_stack_fffffffffffff7a8);
    gfmul_reduce256(in_stack_fffffffffffff7d0);
    local_160 = local_5e0;
    lStack_158 = lStack_5d8;
    uStack_150 = uStack_5d0;
    uStack_148 = uStack_5c8;
    local_5a0 = local_5e0;
    lStack_598 = lStack_5d8;
  }
  auVar4._8_8_ = lStack_598;
  auVar4._0_8_ = local_5a0;
  ppVar6 = (ptls_fusion_aesgcm_ghash_precompute128 *)0x93;
  _ok((uint)(auVar4 == _DAT_00152ab0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c");
  if ((local_2a8->ecb).aesni256 == '\0') {
    local_280 = 0;
    uStack_278 = 0;
    local_6d0.lo[0] = 0;
    local_6d0.lo[1] = 0;
    local_1e8 = "The quick brown fox jumps over the lazy dog.";
    X_12[0] = (undefined1 *)((long)&local_2a8[1].ecb.keys + 0x40);
    X_12[1] = extraout_RDX_03;
    gfmul_firststep128(&local_6d0,X_12,ppVar6);
    local_1f0 = "fox jumps over the lazy dog.";
    X_13[0] = (undefined1 *)((long)&local_2a8[1].ecb.keys + 0x20);
    X_13[1] = extraout_RDX_04;
    gfmul_nextstep128(&local_6d0,X_13,ppVar6);
    local_1f8 = "he lazy dog.";
    X_14[0] = local_2a8 + 1;
    X_14[1] = extraout_RDX_05;
    gfmul_nextstep128(&local_6d0,X_14,ppVar6);
    gfmul_reduce128(&local_6d0);
    local_640 = local_6d0.lo[0];
    lStack_638 = local_6d0.lo[1];
  }
  else {
    local_e0 = 0;
    uStack_d8 = 0;
    uStack_d0 = 0;
    uStack_c8 = 0;
    local_6a0.lo[0] = 0;
    local_6a0.lo[1] = 0;
    local_6a0.lo[2] = 0;
    local_6a0.lo[3] = 0;
    local_48 = "The quick brown fox jumps over the lazy dog.";
    in_stack_fffffffffffff7d0 = &local_6a0;
    X_01[0]._4_4_ = in_stack_fffffffffffff7bc;
    X_01[0]._0_4_ = in_stack_fffffffffffff7b8;
    X_01[1] = in_stack_fffffffffffff7c0;
    X_01[2] = (longlong)in_stack_fffffffffffff7c8;
    X_01[3] = (longlong)in_stack_fffffffffffff7d0;
    gfmul_firststep256(in_stack_fffffffffffff7f0,X_01,in_stack_fffffffffffff7b4,
                       in_stack_fffffffffffff7a8);
    local_50 = "fox jumps over the lazy dog.";
    X_02[0]._4_4_ = in_stack_fffffffffffff7bc;
    X_02[0]._0_4_ = in_stack_fffffffffffff7b8;
    X_02[1] = in_stack_fffffffffffff7c0;
    X_02[2] = (longlong)in_stack_fffffffffffff7c8;
    X_02[3] = (longlong)in_stack_fffffffffffff7d0;
    gfmul_nextstep256(in_stack_fffffffffffff7f0,X_02,
                      (ptls_fusion_aesgcm_ghash_precompute256 *)
                      CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    gfmul_reduce256(in_stack_fffffffffffff7d0);
    local_180 = local_6a0.lo[0];
    lStack_178 = local_6a0.lo[1];
    lStack_170 = local_6a0.lo[2];
    lStack_168 = local_6a0.lo[3];
    local_640 = local_6a0.lo[0];
    lStack_638 = local_6a0.lo[1];
  }
  auVar3._8_8_ = lStack_638;
  auVar3._0_8_ = local_640;
  ppVar6 = (ptls_fusion_aesgcm_ghash_precompute128 *)0xa9;
  _ok((uint)(auVar3 == _DAT_00152ac0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c");
  if ((local_2a8->ecb).aesni256 == '\0') {
    local_290 = 0;
    uStack_288 = 0;
    local_770.lo[0] = 0;
    local_770.lo[1] = 0;
    local_200 = "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor ";
    X_15[0] = (undefined1 *)((long)&local_2a8[1].ecb.keys + 0x60);
    X_15[1] = extraout_RDX_06;
    gfmul_firststep128(&local_770,X_15,ppVar6);
    local_208 = "r sit amet, consectetur adipiscing elit, sed do eiusmod tempor ";
    X_16[0] = (undefined1 *)((long)&local_2a8[1].ecb.keys + 0x40);
    X_16[1] = extraout_RDX_07;
    gfmul_nextstep128(&local_770,X_16,ppVar6);
    local_210 = "ectetur adipiscing elit, sed do eiusmod tempor ";
    X_17[0] = (undefined1 *)((long)&local_2a8[1].ecb.keys + 0x20);
    X_17[1] = extraout_RDX_08;
    gfmul_nextstep128(&local_770,X_17,ppVar6);
    local_218 = "ng elit, sed do eiusmod tempor ";
    X_18[0] = local_2a8 + 1;
    X_18[1] = extraout_RDX_09;
    gfmul_nextstep128(&local_770,X_18,ppVar6);
    gfmul_reduce128(&local_770);
    local_220 = "eiusmod tempor ";
    X_19[0] = local_2a8 + 1;
    X_19[1] = extraout_RDX_10;
    gfmul_firststep128(&local_770,X_19,ppVar6);
    gfmul_reduce128(&local_770);
    local_6e0 = local_770.lo[0];
    lStack_6d8 = local_770.lo[1];
  }
  else {
    local_100 = 0;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    local_720 = 0;
    lStack_718 = 0;
    uStack_710 = 0;
    uStack_708 = 0;
    local_58 = "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor ";
    in_stack_fffffffffffff7c8 = local_740;
    X_03[0]._4_4_ = in_stack_fffffffffffff7bc;
    X_03[0]._0_4_ = in_stack_fffffffffffff7b8;
    X_03[1] = in_stack_fffffffffffff7c0;
    X_03[2] = (longlong)in_stack_fffffffffffff7c8;
    X_03[3] = (longlong)in_stack_fffffffffffff7d0;
    gfmul_firststep256(in_stack_fffffffffffff7f0,X_03,in_stack_fffffffffffff7b4,
                       in_stack_fffffffffffff7a8);
    local_60 = "ectetur adipiscing elit, sed do eiusmod tempor ";
    X_04[0]._4_4_ = in_stack_fffffffffffff7bc;
    X_04[0]._0_4_ = in_stack_fffffffffffff7b8;
    X_04[1] = in_stack_fffffffffffff7c0;
    X_04[2] = (longlong)in_stack_fffffffffffff7c8;
    X_04[3] = (longlong)in_stack_fffffffffffff7d0;
    gfmul_nextstep256(in_stack_fffffffffffff7f0,X_04,
                      (ptls_fusion_aesgcm_ghash_precompute256 *)
                      CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    gfmul_reduce256(in_stack_fffffffffffff7d0);
    local_68 = "eiusmod tempor ";
    X_05[0]._4_4_ = in_stack_fffffffffffff7bc;
    X_05[0]._0_4_ = in_stack_fffffffffffff7b8;
    X_05[1] = in_stack_fffffffffffff7c0;
    X_05[2] = (longlong)in_stack_fffffffffffff7c8;
    X_05[3] = (longlong)in_stack_fffffffffffff7d0;
    gfmul_firststep256(in_stack_fffffffffffff7f0,X_05,in_stack_fffffffffffff7b4,
                       in_stack_fffffffffffff7a8);
    gfmul_reduce256(in_stack_fffffffffffff7d0);
    local_1a0 = local_720;
    lStack_198 = lStack_718;
    uStack_190 = uStack_710;
    uStack_188 = uStack_708;
    local_6e0 = local_720;
    lStack_6d8 = lStack_718;
  }
  auVar2._8_8_ = lStack_6d8;
  auVar2._0_8_ = local_6e0;
  ppVar6 = (ptls_fusion_aesgcm_ghash_precompute128 *)0xc5;
  _ok((uint)(auVar2 == _DAT_00152ad0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c");
  if ((local_2a8->ecb).aesni256 == '\0') {
    local_2a0 = 0;
    uStack_298 = 0;
    local_228 = 
    "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut la"
    ;
    X_20[0] = (undefined1 *)((long)&local_2a8[1].ecb.keys + 0x60);
    X_20[1] = extraout_RDX_11;
    gfmul_firststep128((ptls_fusion_gfmul_state128 *)&stack0xfffffffffffff7f0,X_20,ppVar6);
    local_230 = "r sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut la";
    X_21[0] = (undefined1 *)((long)&local_2a8[1].ecb.keys + 0x40);
    X_21[1] = extraout_RDX_12;
    gfmul_nextstep128((ptls_fusion_gfmul_state128 *)&stack0xfffffffffffff7f0,X_21,ppVar6);
    local_238 = "ectetur adipiscing elit, sed do eiusmod tempor incididunt ut la";
    X_22[0] = (undefined1 *)((long)&local_2a8[1].ecb.keys + 0x20);
    X_22[1] = extraout_RDX_13;
    gfmul_nextstep128((ptls_fusion_gfmul_state128 *)&stack0xfffffffffffff7f0,X_22,ppVar6);
    local_240 = "ng elit, sed do eiusmod tempor incididunt ut la";
    X_23[0] = local_2a8 + 1;
    X_23[1] = extraout_RDX_14;
    gfmul_nextstep128((ptls_fusion_gfmul_state128 *)&stack0xfffffffffffff7f0,X_23,ppVar6);
    gfmul_reduce128((ptls_fusion_gfmul_state128 *)&stack0xfffffffffffff7f0);
    local_248 = "eiusmod tempor incididunt ut la";
    X_24[0] = (undefined1 *)((long)&local_2a8[1].ecb.keys + 0x20);
    X_24[1] = extraout_RDX_15;
    gfmul_firststep128((ptls_fusion_gfmul_state128 *)&stack0xfffffffffffff7f0,X_24,ppVar6);
    local_250 = "ncididunt ut la";
    X_25[0] = local_2a8 + 1;
    X_25[1] = extraout_RDX_16;
    gfmul_nextstep128((ptls_fusion_gfmul_state128 *)&stack0xfffffffffffff7f0,X_25,ppVar6);
    gfmul_reduce128((ptls_fusion_gfmul_state128 *)&stack0xfffffffffffff7f0);
    local_780 = 0;
    uStack_778 = 0;
  }
  else {
    local_120 = 0;
    uStack_118 = 0;
    uStack_110 = 0;
    uStack_108 = 0;
    local_7c0 = 0;
    uStack_7b8 = 0;
    uStack_7b0 = 0;
    uStack_7a8 = 0;
    local_70 = 
    "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut la"
    ;
    puVar9 = local_7e0;
    uVar8 = 0;
    X_06[1] = (longlong)puVar9;
    X_06[0] = (ulong)in_stack_fffffffffffff7b8;
    X_06[2] = (longlong)in_stack_fffffffffffff7c8;
    X_06[3] = (longlong)in_stack_fffffffffffff7d0;
    gfmul_firststep256(in_stack_fffffffffffff7f0,X_06,in_stack_fffffffffffff7b4,
                       in_stack_fffffffffffff7a8);
    local_78 = "ectetur adipiscing elit, sed do eiusmod tempor incididunt ut la";
    X_07[0]._4_4_ = uVar8;
    X_07[0]._0_4_ = in_stack_fffffffffffff7b8;
    X_07[1] = (longlong)puVar9;
    X_07[2] = (longlong)in_stack_fffffffffffff7c8;
    X_07[3] = (longlong)in_stack_fffffffffffff7d0;
    gfmul_nextstep256(in_stack_fffffffffffff7f0,X_07,
                      (ptls_fusion_aesgcm_ghash_precompute256 *)
                      CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    gfmul_reduce256(in_stack_fffffffffffff7d0);
    local_80 = "eiusmod tempor incididunt ut la";
    X_08[0]._4_4_ = uVar8;
    X_08[0]._0_4_ = in_stack_fffffffffffff7b8;
    X_08[1] = (longlong)puVar9;
    X_08[2] = (longlong)in_stack_fffffffffffff7c8;
    X_08[3] = (longlong)in_stack_fffffffffffff7d0;
    gfmul_firststep256(in_stack_fffffffffffff7f0,X_08,in_stack_fffffffffffff7b4,
                       in_stack_fffffffffffff7a8);
    gfmul_reduce256(in_stack_fffffffffffff7d0);
    local_1c0 = local_7c0;
    uStack_1b8 = uStack_7b8;
    uStack_1b0 = uStack_7b0;
    uStack_1a8 = uStack_7a8;
    local_780 = local_7c0;
    uStack_778 = uStack_7b8;
  }
  auVar1._8_8_ = uStack_778;
  auVar1._0_8_ = local_780;
  _ok((uint)(auVar1 == _DAT_00152ae0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c",0xe2);
  free(local_2a8);
  return;
}

Assistant:

static void test_gfmul(void)
{
    ptls_fusion_aesgcm_context_t *ctx;
    size_t ghash_cnt = 4;

    ctx = malloc(calc_aesgcm_context_size(&ghash_cnt, ptls_fusion_can_aesni256));
    *ctx = (ptls_fusion_aesgcm_context_t){
        .ecb = {.aesni256 = ptls_fusion_can_aesni256},
        .capacity = ghash_cnt * 16,
    };

    __m128i H0 = _mm_loadu_si128((void *)"hello world bye");
    if (ctx->ecb.aesni256) {
        ((struct ptls_fusion_aesgcm_context256 *)ctx)->ghash[0].H[1] = H0;
    } else {
        ((struct ptls_fusion_aesgcm_context128 *)ctx)->ghash[0].H = H0;
    }

    while (ctx->ghash_cnt < ghash_cnt)
        setup_one_ghash_entry(ctx);

#define GHASH128 (((struct ptls_fusion_aesgcm_context128 *)ctx)->ghash)
#define GHASH256 (((struct ptls_fusion_aesgcm_context256 *)ctx)->ghash)

    {                                                     /* one block */
        static const char input[32] = "deaddeadbeefbeef"; /* latter 16-bytes are NUL */
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 1, GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\x12\xd9\xd9\x14\x8b\x3f\x20\xbd\x20\x2a\xa5\x9e\x17\xa8\xb0\x7b", 16) == 0);
    }

    { /* two blocks */
        static const char input[32] = "Lorem ipsum dolor sit amet, con";
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 0, GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 16)), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\xda\xdf\xe8\x9b\xc7\x8c\xbd\x5c\xa7\xc1\x83\x9a\xa2\x9f\x80\x55", 16) == 0);
    }

    { /* three blocks */
        static const char input[64] = "The quick brown fox jumps over the lazy dog.";
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 1, GHASH256 + 1);
            gfmul_nextstep256(&state, _mm256_loadu_si256((void *)(input + 16)), GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128 + 2);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 16)), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 32)), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\xad\xdf\x91\x52\x38\x40\xf7\xc3\x85\xaf\x41\xb1\x7d\xed\x4b\x56", 16) == 0);
    }

    { /* five blocks */
        static const char input[96] =
            "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor "; /* last 16 bytes are NUL */
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 0, GHASH256 + 1);
            gfmul_nextstep256(&state, _mm256_loadu_si256((void *)(input + 32)), GHASH256);
            gfmul_reduce256(&state);
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)(input + 64)), 1, GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128 + 3);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 16)), GHASH128 + 2);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 32)), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 48)), GHASH128);
            gfmul_reduce128(&state);
            gfmul_firststep128(&state, _mm_loadu_si128((void *)(input + 64)), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\xb8\xab\x1b\xa8\xf2\x92\xf3\x89\x44\x9d\x39\xf6\xb6\x37\xca\x5d", 16) == 0);
    }

    { /* six blocks */
        static const char input[96] =
            "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut la";
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 0, GHASH256 + 1);
            gfmul_nextstep256(&state, _mm256_loadu_si256((void *)(input + 32)), GHASH256);
            gfmul_reduce256(&state);
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)(input + 64)), 0, GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128 + 3);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 16)), GHASH128 + 2);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 32)), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 48)), GHASH128);
            gfmul_reduce128(&state);
            gfmul_firststep128(&state, _mm_loadu_si128((void *)(input + 64)), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 80)), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\x52\xce\x25\x22\x86\x2c\x91\xa4\xe7\x4e\xf9\x9a\x32\x77\xbd\x3e", 16) == 0);
    }

    free(ctx);

#undef GHASH128
#undef GHASH256
}